

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O3

void __thiscall Js::Profiler::Push(Profiler *this,TimeEntry entry)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  _func_void *p_Var1;
  TypeNode *pTVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  UnitData *this_01;
  TreeNode<Js::UnitData,_373> *pTVar6;
  ulong uVar7;
  TimeEntry item;
  
  item.time = entry.time;
  item._0_4_ = entry._0_4_;
  if (this->curNode == (TypeNode *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileInstrument.cpp"
                                ,0xa3,"(0 != curNode)","Profiler Stack Corruption");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  item._4_4_ = 0;
  FixedStack<Js::TimeEntry,_20>::Push(&this->timeStack,item);
  pTVar6 = this->curNode->children[item._0_4_ & 0xffff];
  if (pTVar6 == (TreeNode<Js::UnitData,_373> *)0x0) {
    this_00 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
    ;
    p_Var1 = (this_00->super_Allocator).outOfMemoryFunc;
    (this_00->super_Allocator).outOfMemoryFunc = (_func_void *)0x0;
    this_01 = (UnitData *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              AllocInternal(this_00,0xbd0);
    (this_00->super_Allocator).outOfMemoryFunc = p_Var1;
    pTVar2 = this->curNode;
    UnitData::UnitData(this_01);
    this_01[0x5e].incl = (TimeStamp)pTVar2;
    memset(this_01 + 1,0,0xba8);
    uVar7 = (ulong)((item._0_4_ & 0xffff) << 3);
    *(UnitData **)((long)this->curNode->children + uVar7) = this_01;
    pTVar6 = *(TreeNode<Js::UnitData,_373> **)((long)this->curNode->children + uVar7);
  }
  this->curNode = pTVar6;
  return;
}

Assistant:

void
    Profiler::Push(TimeEntry entry)
    {
        AssertMsg(NULL != curNode, "Profiler Stack Corruption");

        this->timeStack.Push(entry);
        if(!curNode->ChildExistsAt(entry.tag))
        {
            TypeNode * node = AnewNoThrow(this->alloc, TypeNode, curNode);
            // We crash if we run out of memory here and we don't care
            curNode->SetChildAt(entry.tag, node);
        }
        curNode = curNode->GetChildAt(entry.tag);
    }